

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

void __thiscall
just_test_test_case_test_read_back_content::just_test_test_case_test_read_back_content
          (just_test_test_case_test_read_back_content *this)

{
  test_manager *this_00;
  allocator<char> local_31;
  string local_30;
  just_test_test_case_test_read_back_content *local_10;
  just_test_test_case_test_read_back_content *this_local;
  
  local_10 = this;
  this_00 = just::test::singleton<just::test::test_manager>::get();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"test_read_back_content",&local_31);
  just::test::test_manager::add(this_00,&local_30,just_test_test_case_f_test_read_back_content);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

JUST_TEST_CASE(test_read_back_content)
{
  read_back_tester test;

  test("");
  test("hello world");
  test("hello\nworld");
  test("hello\rworld");
  test("hello\r\nworld");
}